

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.hpp
# Opt level: O3

string * RRStepTypeToStr_abi_cxx11_(string *__return_storage_ptr__,RRStepType step)

{
  logic_error *this;
  char *pcVar1;
  char *pcVar2;
  
  switch(step) {
  case I:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "I";
    pcVar1 = "";
    break;
  case J:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "J";
    pcVar1 = "";
    break;
  case K:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "K";
    pcVar1 = "";
    break;
  case L:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "L";
    pcVar1 = "";
    break;
  default:
    this = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this,"Missing RRStepType");
    __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

inline std::string RRStepTypeToStr(RRStepType step)
{
    switch(step)
    {
        case RRStepType::I:
            return "I";
        case RRStepType::J:
            return "J";
        case RRStepType::K:
            return "K";
        case RRStepType::L:
            return "L";
        default:
            throw std::logic_error("Missing RRStepType");
    }
}